

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::setOverrideMenuAction(QMenuPrivate *this,QAction *a)

{
  QObject *pQVar1;
  QAction *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *q;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QObject *)q_func(in_RDI);
  QObject::disconnect((QObject *)in_RDI->menuAction,"2destroyed()",pQVar1,
                      "1_q_overrideMenuActionDestroyed()");
  if (in_RSI == (QAction *)0x0) {
    in_RDI->menuAction = in_RDI->defaultMenuAction;
  }
  else {
    in_RDI->menuAction = in_RSI;
    QObject::connect((QObject *)&local_10,(char *)in_RSI,(QObject *)"2destroyed()",(char *)pQVar1,
                     0xb20654);
    QMetaObject::Connection::~Connection(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::setOverrideMenuAction(QAction *a)
{
    Q_Q(QMenu);
    QObject::disconnect(menuAction, SIGNAL(destroyed()), q, SLOT(_q_overrideMenuActionDestroyed()));
    if (a) {
        menuAction = a;
        QObject::connect(a, SIGNAL(destroyed()), q, SLOT(_q_overrideMenuActionDestroyed()));
    } else { //we revert back to the default action created by the QMenu itself
        menuAction = defaultMenuAction;
    }
}